

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O3

void __thiscall
tf::
ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
::ScalablePipeline(ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
                   *this,ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
                         *rhs)

{
  pointer pTVar1;
  pointer p_Var2;
  pointer pPVar3;
  
  (this->_graph).
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_graph).
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_graph).
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_num_tokens = rhs->_num_tokens;
  p_Var2 = (rhs->_pipes).
           super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->_pipes).
  super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (rhs->_pipes).
       super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->_pipes).
  super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = p_Var2;
  (this->_pipes).
  super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (rhs->_pipes).
       super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (rhs->_pipes).
  super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rhs->_pipes).
  super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (rhs->_pipes).
  super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_tasks).super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_tasks).super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_tasks).super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar3 = (rhs->_pipeflows).super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->_pipeflows).super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
  super__Vector_impl_data._M_start =
       (rhs->_pipeflows).super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->_pipeflows).super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar3;
  (this->_pipeflows).super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (rhs->_pipeflows).super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (rhs->_pipeflows).super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rhs->_pipeflows).super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (rhs->_pipeflows).super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_lines)._M_t.
  super___uniq_ptr_impl<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line,_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line_*,_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
  .
  super__Head_base<0UL,_tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line_*,_false>
  ._M_head_impl =
       (rhs->_lines)._M_t.
       super___uniq_ptr_impl<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line,_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line_*,_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
       .
       super__Head_base<0UL,_tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line_*,_false>
       ._M_head_impl;
  (rhs->_lines)._M_t.
  super___uniq_ptr_impl<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line,_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line_*,_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
  .
  super__Head_base<0UL,_tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line_*,_false>
  ._M_head_impl = (Line *)0x0;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_Deque_base((_Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)&this->_ready_tokens,
                (_Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)&rhs->_ready_tokens);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->_token_dependencies)._M_h,&rhs->_token_dependencies);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->_deferred_tokens)._M_h,&rhs->_deferred_tokens);
  this->_longest_deferral = rhs->_longest_deferral;
  std::
  vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ::_M_erase_at_end((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                     *)this,(this->_graph).
                            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                            .
                            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::vector<tf::Task,_std::allocator<tf::Task>_>::resize
            (&this->_tasks,
             ((long)(this->_pipeflows).
                    super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->_pipeflows).
                    super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5) * -0x5555555555555555 + 1);
  rhs->_longest_deferral = 0;
  rhs->_num_tokens = 0;
  pTVar1 = (rhs->_tasks).super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((rhs->_tasks).super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar1) {
    (rhs->_tasks).super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar1;
  }
  _build(this);
  return;
}

Assistant:

ScalablePipeline<P>::ScalablePipeline(ScalablePipeline&& rhs):
  _num_tokens           {rhs._num_tokens},
  _pipes                {std::move(rhs._pipes)},
  _pipeflows            {std::move(rhs._pipeflows)},
  _lines                {std::move(rhs._lines)},
  _ready_tokens         {std::move(rhs._ready_tokens)},
  _token_dependencies   {std::move(rhs._token_dependencies)},
  _deferred_tokens      {std::move(rhs._deferred_tokens)},
  _longest_deferral     {rhs._longest_deferral}{


  //_num_tokens = rhs._num_tokens;

  //_pipes.resize(rhs.num_pipes());
  //size_t i=0;
  //for(auto itr = rhs._pipes.begin(); itr != rhs._pipes.end(); itr++) {
  //  _pipes[i++] = *itr;
  //}


  //_pipeflows.resize(rhs.num_lines());
  //for(size_t l = 0; l<rhs.num_lines(); l++) {
  //  _pipeflows[l]._pipe = rhs._pipeflows[l]._pipe;
  //  _pipeflows[l]._line = rhs._pipeflows[l]._line;
  //  _pipeflows[l]._num_deferrals = 0;
  //  _pipeflows[l]._dependents.clear();
  //}

  //_lines = std::make_unique<Line[]>(rhs.num_lines() * rhs._pipes.size());
  //for(size_t l=0; l<num_lines(); l++) {
  //  for(size_t f=0; f<num_pipes(); f++) {
  //    _line(l, f).join_counter.store(
  //      rhs._line(l, f).join_counter, std::memory_order_relaxed
  //    );
  //  }
  //}
 
  //_ready_tokens = std::move(rhs._ready_tokens);
  //_token_dependencies = std::move(rhs._token_dependencies);
  //_deferred_tokens = std::move(rhs._deferred_tokens);

  _graph.clear();
  _tasks.resize(_pipeflows.size()+1);
  rhs._longest_deferral = 0;
  rhs._num_tokens       = 0;
  rhs._tasks.clear();
  _build();
}